

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

bool DiffTest<Blob<64>,unsigned_int>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  Blob<64> k2;
  Blob<64> k1;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> diffs;
  uint h2;
  uint h1;
  Rand local_48;
  
  dVar4 = chooseUpToK(0x40,diffbits);
  uVar3 = 0;
  diffs.super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  k1.bytes[0] = '\0';
  k1.bytes[1] = '\0';
  k1.bytes[2] = '\0';
  k1.bytes[3] = '\0';
  k1.bytes[4] = '\0';
  k1.bytes[5] = '\0';
  k1.bytes[6] = '\0';
  k1.bytes[7] = '\0';
  k2.bytes[0] = '\0';
  k2.bytes[1] = '\0';
  k2.bytes[2] = '\0';
  k2.bytes[3] = '\0';
  k2.bytes[4] = '\0';
  k2.bytes[5] = '\0';
  k2.bytes[6] = '\0';
  k2.bytes[7] = '\0';
  local_48.x = 0x331facd4;
  local_48.y = 0x1046679a;
  local_48.z = 0x5cd2ef35;
  local_48.w = 0xfda8c6ef;
  diffs.super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>._M_impl.super__Vector_impl_data.
  _0_16_ = ZEXT816(0) << 0x20;
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         (ulong)(uint)diffbits,0x40,0x20);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",dVar4 * (double)reps,
         dVar4 * (double)reps * 2.3283064365386963e-10,(ulong)(uint)reps);
  if (0 < reps) {
    do {
      if ((int)(uVar3 % ((ulong)(uint)reps / 10)) == 0) {
        putchar(0x2e);
      }
      Rand::rand_p(&local_48,&k1,8);
      k2 = k1;
      (*hash)(&k1,8,0,&h1);
      DiffTestRecurse<Blob<64>,unsigned_int>(hash,&k1,&k2,&h1,&h2,0,diffbits,&diffs);
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while (reps != uVar2);
  }
  putchar(10);
  bVar1 = ProcessDifferentials<Blob<64>>(&diffs,reps,dumpCollisions);
  if (diffs.super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(diffs.super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}